

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O0

size_t __thiscall GdlPass::TotalNumGlyphSubRanges(GdlPass *this)

{
  size_type_conflict sVar1;
  size_t sVar2;
  long in_RDI;
  FsmMachineClass *unaff_retaddr;
  size_t i;
  size_t cRanges;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::size
                      ((vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)
                       (in_RDI + 0xe8));
    if (sVar1 <= local_18) break;
    std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::operator[]
              ((vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)(in_RDI + 0xe8),
               local_18);
    sVar2 = FsmMachineClass::NumberOfRanges(unaff_retaddr);
    local_10 = sVar2 + local_10;
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

size_t GdlPass::TotalNumGlyphSubRanges()
{
	size_t cRanges = 0;
	for (size_t i = 0; i < m_vpfsmc.size(); i++)
		cRanges += m_vpfsmc[i]->NumberOfRanges();

	return cRanges;
}